

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChMarker.cpp
# Opt level: O1

void __thiscall
chrono::ChMarker::ChMarker
          (ChMarker *this,string *name,ChBody *body,ChCoordsys<double> *rel_pos,
          ChCoordsys<double> *rel_pos_dt,ChCoordsys<double> *rel_pos_dtdt)

{
  ChFrameMoving<double> *this_00;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var2;
  ChVector<double> local_68;
  ChQuaternion<double> local_50;
  
  ChObj::ChObj(&this->super_ChObj);
  this_00 = &this->super_ChFrameMoving<double>;
  local_68.m_data[2] = 0.0;
  local_68.m_data[0] = 0.0;
  local_68.m_data[1] = 0.0;
  local_50.m_data[0] = 1.0;
  local_50.m_data[1] = 0.0;
  local_50.m_data[2] = 0.0;
  local_50.m_data[3] = 0.0;
  ChFrameMoving<double>::ChFrameMoving(this_00,&local_68,&local_50);
  (this->super_ChObj)._vptr_ChObj = (_func_int **)&PTR__ChMarker_00b2b038;
  (this->super_ChFrameMoving<double>).super_ChFrame<double>._vptr_ChFrame =
       (_func_int **)&PTR__ChMarker_00b2b078;
  (this->rest_coord).pos.m_data[0] = 0.0;
  (this->rest_coord).pos.m_data[1] = 0.0;
  (this->rest_coord).pos.m_data[2] = 0.0;
  (this->motion_X).super___shared_ptr<chrono::ChFunction,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  (this->motion_X).super___shared_ptr<chrono::ChFunction,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (this->motion_Y).super___shared_ptr<chrono::ChFunction,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  (this->motion_Y).super___shared_ptr<chrono::ChFunction,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (this->motion_Z).super___shared_ptr<chrono::ChFunction,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  (this->motion_Z).super___shared_ptr<chrono::ChFunction,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (this->motion_ang).super___shared_ptr<chrono::ChFunction,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  (this->motion_ang).super___shared_ptr<chrono::ChFunction,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (this->motion_Y).super___shared_ptr<chrono::ChFunction,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (this->motion_Z).super___shared_ptr<chrono::ChFunction,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  (this->motion_Z).super___shared_ptr<chrono::ChFunction,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (this->motion_ang).super___shared_ptr<chrono::ChFunction,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  (this->motion_ang).super___shared_ptr<chrono::ChFunction,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (this->motion_axis).m_data[0] = 0.0;
  (this->motion_axis).m_data[1] = 0.0;
  (this->motion_axis).m_data[2] = 0.0;
  (this->rest_coord).rot.m_data[0] = 1.0;
  *(undefined1 (*) [32])((this->rest_coord).rot.m_data + 1) = ZEXT432(0) << 0x40;
  *(undefined1 (*) [32])((this->rest_coord).rot.m_data + 3) = ZEXT432(0) << 0x40;
  (this->last_rel_coord).rot.m_data[0] = 1.0;
  *(undefined1 (*) [32])((this->last_rel_coord).rot.m_data + 1) = ZEXT432(0) << 0x40;
  *(undefined1 (*) [32])((this->last_rel_coord).rot.m_data + 3) = ZEXT432(0) << 0x40;
  (this->last_rel_coord_dt).rot.m_data[0] = 1.0;
  (this->last_rel_coord_dt).rot.m_data[1] = 0.0;
  (this->last_rel_coord_dt).rot.m_data[2] = 0.0;
  (this->last_rel_coord_dt).rot.m_data[3] = 0.0;
  local_68.m_data[2] = 0.0;
  local_68.m_data[0] = 0.0;
  local_68.m_data[1] = 0.0;
  local_50.m_data[0] = 1.0;
  local_50.m_data[1] = 0.0;
  local_50.m_data[2] = 0.0;
  local_50.m_data[3] = 0.0;
  ChFrameMoving<double>::ChFrameMoving(&this->abs_frame,&local_68,&local_50);
  std::__cxx11::string::_M_assign((string *)&(this->super_ChObj).m_name);
  this->Body = body;
  p_Var2 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)::operator_new(0x20);
  p_Var2->_M_use_count = 1;
  p_Var2->_M_weak_count = 1;
  p_Var2->_vptr__Sp_counted_base = (_func_int **)&PTR___Sp_counted_ptr_inplace_00b2b660;
  p_Var2[1]._vptr__Sp_counted_base = (_func_int **)&PTR__ChFunction_00b6c330;
  p_Var2[1]._M_use_count = 0;
  p_Var2[1]._M_weak_count = 0;
  (this->motion_X).super___shared_ptr<chrono::ChFunction,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)(p_Var2 + 1);
  p_Var1 = (this->motion_X).super___shared_ptr<chrono::ChFunction,_(__gnu_cxx::_Lock_policy)2>.
           _M_refcount._M_pi;
  (this->motion_X).super___shared_ptr<chrono::ChFunction,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = p_Var2;
  if (p_Var1 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var1);
  }
  p_Var2 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)::operator_new(0x20);
  p_Var2->_M_use_count = 1;
  p_Var2->_M_weak_count = 1;
  p_Var2->_vptr__Sp_counted_base = (_func_int **)&PTR___Sp_counted_ptr_inplace_00b2b660;
  p_Var2[1]._vptr__Sp_counted_base = (_func_int **)&PTR__ChFunction_00b6c330;
  p_Var2[1]._M_use_count = 0;
  p_Var2[1]._M_weak_count = 0;
  (this->motion_Y).super___shared_ptr<chrono::ChFunction,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)(p_Var2 + 1);
  p_Var1 = (this->motion_Y).super___shared_ptr<chrono::ChFunction,_(__gnu_cxx::_Lock_policy)2>.
           _M_refcount._M_pi;
  (this->motion_Y).super___shared_ptr<chrono::ChFunction,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = p_Var2;
  if (p_Var1 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var1);
  }
  p_Var2 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)::operator_new(0x20);
  p_Var2->_M_use_count = 1;
  p_Var2->_M_weak_count = 1;
  p_Var2->_vptr__Sp_counted_base = (_func_int **)&PTR___Sp_counted_ptr_inplace_00b2b660;
  p_Var2[1]._vptr__Sp_counted_base = (_func_int **)&PTR__ChFunction_00b6c330;
  p_Var2[1]._M_use_count = 0;
  p_Var2[1]._M_weak_count = 0;
  (this->motion_Z).super___shared_ptr<chrono::ChFunction,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)(p_Var2 + 1);
  p_Var1 = (this->motion_Z).super___shared_ptr<chrono::ChFunction,_(__gnu_cxx::_Lock_policy)2>.
           _M_refcount._M_pi;
  (this->motion_Z).super___shared_ptr<chrono::ChFunction,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = p_Var2;
  if (p_Var1 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var1);
  }
  p_Var2 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)::operator_new(0x20);
  p_Var2->_M_use_count = 1;
  p_Var2->_M_weak_count = 1;
  p_Var2->_vptr__Sp_counted_base = (_func_int **)&PTR___Sp_counted_ptr_inplace_00b2b660;
  p_Var2[1]._vptr__Sp_counted_base = (_func_int **)&PTR__ChFunction_00b6c330;
  p_Var2[1]._M_use_count = 0;
  p_Var2[1]._M_weak_count = 0;
  (this->motion_ang).super___shared_ptr<chrono::ChFunction,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)(p_Var2 + 1);
  p_Var1 = (this->motion_ang).super___shared_ptr<chrono::ChFunction,_(__gnu_cxx::_Lock_policy)2>.
           _M_refcount._M_pi;
  (this->motion_ang).super___shared_ptr<chrono::ChFunction,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = p_Var2;
  if (p_Var1 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var1);
  }
  if (this != (ChMarker *)&DAT_00b90988) {
    (this->motion_axis).m_data[0] = VECT_Z;
    (this->motion_axis).m_data[1] = DAT_00b90b08;
    (this->motion_axis).m_data[2] = DAT_00b90b10;
  }
  if (this != (ChMarker *)&DAT_00b909c0) {
    (this->rest_coord).pos.m_data[0] = CSYSNORM;
    (this->rest_coord).pos.m_data[1] = DAT_00b90b60;
    (this->rest_coord).pos.m_data[2] = DAT_00b90b68;
    (this->rest_coord).rot.m_data[0] = DAT_00b90b70;
    (this->rest_coord).rot.m_data[1] = DAT_00b90b78;
    (this->rest_coord).rot.m_data[2] = DAT_00b90b80;
    (this->rest_coord).rot.m_data[3] = DAT_00b90b88;
  }
  this->motion_type = M_MOTION_FUNCTIONS;
  ChFrame<double>::SetCoord(&this_00->super_ChFrame<double>,rel_pos);
  (*(this_00->super_ChFrame<double>)._vptr_ChFrame[6])(this_00,rel_pos_dt);
  (*(this_00->super_ChFrame<double>)._vptr_ChFrame[0xb])(this_00,rel_pos_dtdt);
  if (this != (ChMarker *)&DAT_00b90988) {
    (this->last_rel_coord).pos.m_data[0] = CSYSNORM;
    (this->last_rel_coord).pos.m_data[1] = DAT_00b90b60;
    (this->last_rel_coord).pos.m_data[2] = DAT_00b90b68;
    (this->last_rel_coord).rot.m_data[0] = DAT_00b90b70;
    (this->last_rel_coord).rot.m_data[1] = DAT_00b90b78;
    (this->last_rel_coord).rot.m_data[2] = DAT_00b90b80;
    (this->last_rel_coord).rot.m_data[3] = DAT_00b90b88;
  }
  if (this != (ChMarker *)&DAT_00b90918) {
    (this->last_rel_coord_dt).pos.m_data[0] = CSYSNULL;
    (this->last_rel_coord_dt).pos.m_data[1] = DAT_00b90b28;
    (this->last_rel_coord_dt).pos.m_data[2] = DAT_00b90b30;
    (this->last_rel_coord_dt).rot.m_data[0] = DAT_00b90b38;
    (this->last_rel_coord_dt).rot.m_data[1] = DAT_00b90b40;
    (this->last_rel_coord_dt).rot.m_data[2] = DAT_00b90b48;
    (this->last_rel_coord_dt).rot.m_data[3] = DAT_00b90b50;
  }
  this->last_time = 0.0;
  if (this->Body != (ChBody *)0x0) {
    ChFrameMoving<double>::TransformLocalToParent
              (&(this->Body->super_ChBodyFrame).super_ChFrameMoving<double>,this_00,&this->abs_frame
              );
  }
  return;
}

Assistant:

ChMarker::ChMarker(const std::string& name,
                   ChBody* body,
                   const ChCoordsys<>& rel_pos,
                   const ChCoordsys<>& rel_pos_dt,
                   const ChCoordsys<>& rel_pos_dtdt) {
    SetNameString(name);
    Body = body;

    motion_X = chrono_types::make_shared<ChFunction_Const>(0);  // default: no motion
    motion_Y = chrono_types::make_shared<ChFunction_Const>(0); 
    motion_Z = chrono_types::make_shared<ChFunction_Const>(0); 
    motion_ang = chrono_types::make_shared<ChFunction_Const>(0); 
    motion_axis = VECT_Z;

    rest_coord = CSYSNORM;

    motion_type = M_MOTION_FUNCTIONS;

    SetCoord(rel_pos);
    SetCoord_dt(rel_pos_dt);
    SetCoord_dtdt(rel_pos_dtdt);

    last_rel_coord = CSYSNORM;
    last_rel_coord_dt = CSYSNULL;
    last_time = 0;

    UpdateState();
}